

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

void __thiscall OpenMD::Stats::Stats(Stats *this,SimInfo *info)

{
  SimInfo *in_RSI;
  Stats *in_RDI;
  
  in_RDI->_vptr_Stats = (_func_int **)&PTR__Stats_00501b38;
  in_RDI->info_ = in_RSI;
  in_RDI->isInit_ = false;
  std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::vector
            ((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *)0x3727a0
            );
  std::bitset<46UL>::bitset((bitset<46UL> *)0x3727ae);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
         *)0x3727c1);
  if ((in_RDI->isInit_ & 1U) == 0) {
    init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
    in_RDI->isInit_ = true;
  }
  return;
}

Assistant:

Stats::Stats(SimInfo* info) : info_(info), isInit_(false) {
    if (!isInit_) {
      init();
      isInit_ = true;
    }
  }